

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O1

bool __thiscall ImportedFuncWrapper::isByOrdinal(ImportedFuncWrapper *this)

{
  Executable *pEVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  uint64_t *ptr;
  
  plVar4 = (long *)getValuePtr(this,ORIG_FIRST_THUNK);
  if (plVar4 == (long *)0x0) {
    plVar4 = (long *)getValuePtr(this,FIRST_THUNK);
  }
  if (plVar4 == (long *)0x0) {
LAB_00130bb8:
    bVar2 = false;
  }
  else {
    pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
LAB_00130bb3:
      if (-1 < (int)*plVar4) goto LAB_00130bb8;
    }
    else {
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
      if (iVar3 != 0x40) goto LAB_00130bb3;
      if (-1 < *plVar4) goto LAB_00130bb8;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ImportedFuncWrapper::isByOrdinal()
{
    void *p = getValuePtr(ImportEntryWrapper::ORIG_FIRST_THUNK);
    if (!p) p = getValuePtr(ImportEntryWrapper::FIRST_THUNK);
    if (!p) return false;

    if (isBit64()) {
        uint64_t* ptr =  (uint64_t*) p;
        if ((*ptr) & ORDINAL_FLAG64) return true;

    } else {
        uint32_t* ptr =  (uint32_t*) p;
        if ((*ptr) & ORDINAL_FLAG32) return true;
    }
    return false;
}